

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_name.c
# Opt level: O3

int pull_by_name(char *input_file,FILE *names_fp,int min,int max,int length,int exclude,int convert,
                int just_count)

{
  kstring_t *str;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  kseq_t *seq;
  kstream_t *pkVar7;
  uchar *puVar8;
  lookup_t *plVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int *unaff_RBP;
  size_t __size;
  kstring_t *str_00;
  char **unaff_R12;
  uint uVar15;
  char *line;
  uint uStackY_84;
  ulong uStackY_80;
  char **ppcStackY_78;
  char *pcStackY_70;
  FILE *pFStackY_68;
  code *pcStackY_60;
  char *local_40;
  gzFile local_38;
  
  pcStackY_60 = (code *)0x10409e;
  local_40 = (char *)malloc(0x50);
  if (local_40 == (char *)0x0) {
    pcStackY_60 = (code *)0x1042f0;
    pull_by_name_cold_5();
  }
  else {
    pcStackY_60 = (code *)0x1040b9;
    iVar4 = getl(&local_40,names_fp);
    if (iVar4 != -1) {
      unaff_R12 = &local_40;
      do {
        pcStackY_60 = (code *)0x1040cd;
        pcVar6 = parse_name(local_40);
        if (pcVar6 != (char *)0x0) {
          pcStackY_60 = (code *)0x1040da;
          add_name(pcVar6);
        }
        pcStackY_60 = (code *)0x1040e5;
        iVar4 = getl(unaff_R12,names_fp);
      } while (iVar4 != -1);
    }
    pcStackY_60 = (code *)0x1040f4;
    free(local_40);
    unaff_RBP = &verbose_flag;
    if (verbose_flag != 0) {
      pcStackY_60 = (code *)0x1042c5;
      pull_by_name_cold_1();
    }
    pcStackY_60 = (code *)0x104114;
    local_38 = (gzFile)gzopen(input_file);
    if (local_38 != (gzFile)0x0) {
      pcStackY_60 = (code *)0x10412f;
      seq = (kseq_t *)calloc(1,0x70);
      pcStackY_60 = (code *)0x104141;
      pkVar7 = (kstream_t *)calloc(1,0x20);
      pkVar7->f = local_38;
      pcStackY_60 = (code *)0x104152;
      puVar8 = (uchar *)malloc(0xffff);
      pkVar7->buf = puVar8;
      seq->f = pkVar7;
      pcStackY_60 = (code *)0x104162;
      kseq_read(seq);
      pcVar6 = (seq->qual).s;
      pcStackY_60 = (code *)0x10417f;
      gzrewind(local_38);
      pkVar7 = seq->f;
      pkVar7->begin = 0;
      pkVar7->end = 0;
      uVar15 = 0;
      pkVar7->is_eof = 0;
      seq->last_char = 0;
      if (verbose_flag != 0) {
        pcStackY_60 = (code *)0x1042d8;
        pull_by_name_cold_2();
      }
      pcStackY_60 = (code *)0x1041aa;
      iVar4 = kseq_read(seq);
      uVar13 = 0;
      if (-1 < iVar4) {
        uVar13 = 0;
        uVar15 = 0;
        do {
          pcStackY_60 = (code *)0x1041ce;
          plVar9 = find_name((seq->name).s);
          if (exclude == 0) {
            if (plVar9 != (lookup_t *)0x0) goto LAB_001041e1;
LAB_001041d7:
            uVar15 = uVar15 + 1;
          }
          else {
            if (plVar9 != (lookup_t *)0x0) goto LAB_001041d7;
LAB_001041e1:
            pcStackY_60 = (code *)0x104203;
            iVar4 = size_filter(seq,(uint)(pcVar6 == (char *)0x0),min,max,length,convert,just_count)
            ;
            uVar13 = uVar13 + iVar4;
          }
          pcStackY_60 = (code *)0x10420d;
          iVar4 = kseq_read(seq);
        } while (-1 < iVar4);
      }
      pcStackY_60 = (code *)0x10421b;
      free((seq->name).s);
      pcStackY_60 = (code *)0x104225;
      free((seq->comment).s);
      pcStackY_60 = (code *)0x10422f;
      free((seq->seq).s);
      pcStackY_60 = (code *)0x104239;
      free((seq->qual).s);
      pkVar7 = seq->f;
      if (pkVar7 != (kstream_t *)0x0) {
        pcStackY_60 = (code *)0x10424b;
        free(pkVar7->buf);
        pcStackY_60 = (code *)0x104253;
        free(pkVar7);
      }
      pcStackY_60 = (code *)0x10425b;
      free(seq);
      pcStackY_60 = (code *)0x104265;
      gzclose(local_38);
      pcStackY_60 = (code *)0x10426a;
      delete_hash();
      if (just_count != 0) {
        pcStackY_60 = (code *)0x10428b;
        fprintf(_stdout,"Total output: %i\n",(ulong)uVar13);
        if (exclude != 0) {
          pcStackY_60 = (code *)0x1042a3;
          fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar15);
        }
      }
      if (verbose_flag != 0) {
        pcStackY_60 = (code *)0x1042e9;
        pull_by_name_cold_3();
      }
      return uVar13;
    }
  }
  pcStackY_60 = kseq_read;
  str_00 = (kstring_t *)input_file;
  pull_by_name_cold_4();
  pkVar7 = (kstream_t *)str_00[4].m;
  uStackY_80 = (ulong)(uint)exclude;
  ppcStackY_78 = unaff_R12;
  pcStackY_70 = input_file;
  pFStackY_68 = names_fp;
  pcStackY_60 = (code *)unaff_RBP;
  if ((int)str_00[4].l == 0) {
    iVar4 = pkVar7->begin;
    iVar5 = pkVar7->end;
    iVar14 = -1;
    do {
      if ((pkVar7->is_eof != 0) && (iVar5 <= iVar4)) {
        return -1;
      }
      puVar8 = pkVar7->buf;
      if (iVar5 <= iVar4) {
        pkVar7->begin = 0;
        iVar5 = gzread(pkVar7->f,puVar8,0xffff);
        pkVar7->end = iVar5;
        if (iVar5 == 0) goto LAB_001045e5;
        iVar4 = pkVar7->begin;
        puVar8 = pkVar7->buf;
      }
      lVar12 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pkVar7->begin = iVar4;
      bVar1 = puVar8[lVar12];
      uStackY_84 = (uint)bVar1;
    } while ((uStackY_84 != 0x40) && (bVar1 != 0x3e));
    *(uint *)&str_00[4].l = (uint)bVar1;
  }
  str_00[3].l = 0;
  str_00[2].l = 0;
  str_00[1].l = 0;
  iVar4 = ks_getuntil2(pkVar7,0,str_00,(int *)&uStackY_84,0);
  if (iVar4 < 0) {
    iVar4 = -1;
  }
  else {
    if (uStackY_84 != 10) {
      ks_getuntil2(pkVar7,2,str_00 + 1,(int *)0x0,0);
    }
    if (str_00[2].s == (char *)0x0) {
      str_00[2].m = 0x100;
      pcVar6 = (char *)malloc(0x100);
      str_00[2].s = pcVar6;
    }
    str = str_00 + 2;
    iVar4 = pkVar7->begin;
    iVar5 = pkVar7->end;
    bVar3 = iVar4 < iVar5;
    if (pkVar7->is_eof == 0 || bVar3) {
      do {
        puVar8 = pkVar7->buf;
        if (!bVar3) {
          pkVar7->begin = 0;
          iVar5 = gzread(pkVar7->f,puVar8,0xffff);
          pkVar7->end = iVar5;
          if (iVar5 == 0) {
            pkVar7->is_eof = 1;
            break;
          }
          iVar4 = pkVar7->begin;
          puVar8 = pkVar7->buf;
        }
        lVar12 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pkVar7->begin = iVar4;
        bVar1 = puVar8[lVar12];
        uStackY_84 = (uint)bVar1;
        uVar15 = (uint)bVar1;
        if (uStackY_84 < 0x2b) {
          if (uVar15 != 10) goto LAB_00104459;
        }
        else {
          if (uVar15 == 0x2b) goto LAB_001044c2;
          if ((uVar15 == 0x3e) || (uVar15 == 0x40)) {
            *(uint *)&str_00[4].l = uVar15;
            goto LAB_001044c2;
          }
LAB_00104459:
          sVar11 = str_00[2].l;
          str_00[2].l = sVar11 + 1;
          str_00[2].s[sVar11] = bVar1;
          ks_getuntil2(pkVar7,2,str,(int *)0x0,1);
          iVar4 = pkVar7->begin;
          iVar5 = pkVar7->end;
        }
        bVar3 = iVar4 < iVar5;
      } while ((pkVar7->is_eof == 0) || (iVar4 < iVar5));
    }
    uStackY_84 = 0xffffffff;
LAB_001044c2:
    sVar11 = str_00[2].l;
    pcVar6 = str_00[2].s;
    uVar10 = sVar11 + 1;
    if (str_00[2].m <= uVar10) {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      __size = (uVar10 >> 0x10 | uVar10) + 1;
      str_00[2].m = __size;
      pcVar6 = (char *)realloc(pcVar6,__size);
      str_00[2].s = pcVar6;
      sVar11 = str_00[2].l;
    }
    pcVar6[sVar11] = '\0';
    if (uStackY_84 == 0x2b) {
      uVar10 = str_00[2].m;
      if (str_00[3].m < uVar10) {
        str_00[3].m = uVar10;
        pcVar6 = (char *)realloc(str_00[3].s,uVar10);
        str_00[3].s = pcVar6;
      }
      iVar4 = pkVar7->begin;
      iVar5 = pkVar7->end;
      iVar14 = -2;
      do {
        if ((pkVar7->is_eof != 0) && (iVar5 <= iVar4)) {
          return -2;
        }
        puVar8 = pkVar7->buf;
        if (iVar5 <= iVar4) {
          pkVar7->begin = 0;
          iVar5 = gzread(pkVar7->f,puVar8,0xffff);
          pkVar7->end = iVar5;
          if (iVar5 == 0) {
LAB_001045e5:
            pkVar7->is_eof = 1;
            return iVar14;
          }
          iVar4 = pkVar7->begin;
          puVar8 = pkVar7->buf;
        }
        lVar12 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pkVar7->begin = iVar4;
        uStackY_84 = (uint)puVar8[lVar12];
      } while (uStackY_84 != 10);
      uStackY_84 = 10;
      do {
        iVar4 = ks_getuntil2(pkVar7,2,str_00 + 3,(int *)0x0,1);
        uVar10 = str->l;
        uVar2 = str_00[3].l;
        if (iVar4 < 0) break;
      } while (uVar2 < uVar10);
      *(undefined4 *)&str_00[4].l = 0;
      iVar4 = -2;
      if (uVar10 == uVar2) {
        iVar4 = (int)uVar10;
      }
    }
    else {
      iVar4 = (int)str->l;
    }
  }
  return iVar4;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_name(char *input_file, FILE *names_fp, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int i,l,capacity=80;
	int count=0,excluded=0;
	int is_fasta = -1;
	char *fasta_name;
	char *line;
	kseq_t *seq;

	/* get some space for the line */
	line = malloc(sizeof(char) * capacity); /* get memory allocated */
	if (!line) {
		fprintf(stderr, "%s - line malloc: %s\n",progname, strerror(errno));
		exit(EXIT_FAILURE);
	}

	while((i = getl(&line, names_fp)) != -1) {
		fasta_name = parse_name(line);
		if (fasta_name) {
			add_name(fasta_name);             /* add fasta_name to hash */
		}
	}

	free(line); /* free up line */

	if (verbose_flag) {
		fprintf(stderr,"\n");
		fprintf(stderr,"done reading from input (%d entries)\n", hash_key_count());
	}
	/*print_hash();*/


	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); /* rewind to beginning for main loop */
	kseq_rewind(seq);

	if (verbose_flag) {
		if (is_fasta)
			fprintf(stderr, "Input is FASTA format\n");
		else
			fprintf(stderr, "Input is FASTQ format\n");
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude == 0) { /* INCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			else
				excluded++;
		} else { /* EXCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				excluded++;
			else
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
		}
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	delete_hash(); /* free the list nodes */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		if (exclude)
			fprintf(stdout, "Total excluded: %i\n", excluded);
	}

	if (verbose_flag) {
		fprintf(stderr,"Processed %i entries\n",count);
		if (exclude)
			fprintf(stderr,"Excluded %i entries\n",excluded);
	}
	return count;
}